

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process_file_name.hpp
# Opt level: O1

size_t pstore::
       process_file_name<unsigned_long(*)(pstore::gsl::span<char,_1l>),pstore::small_vector<char,128ul>>
                 (_func_unsigned_long_span<char,__1L> *get_process_path,
                 small_vector<char,_128UL> *buffer)

{
  char *pcVar1;
  ulong uVar2;
  unsigned_long uVar3;
  ulong new_elements;
  span<char,__1L> sVar4;
  extent_type<_1L> local_38 [2];
  
  uVar2 = (long)(buffer->big_buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage -
          (long)(buffer->big_buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start;
  new_elements = 0x80;
  if (0x80 < uVar2) {
    new_elements = uVar2;
  }
  do {
    while( true ) {
      small_vector<char,_128UL>::resize(buffer,new_elements);
      pcVar1 = buffer->buffer_;
      gsl::details::extent_type<-1L>::extent_type(local_38,buffer->elements_);
      sVar4.storage_.data_ = pcVar1;
      sVar4.storage_.super_extent_type<_1L>.size_ = local_38[0].size_;
      uVar3 = (*get_process_path)(sVar4);
      uVar2 = (new_elements >> 1) + new_elements;
      new_elements = uVar2;
      if (uVar2 < uVar3) {
        new_elements = uVar3;
      }
      if (uVar3 == 0) break;
      if ((0xffffff < new_elements) || (uVar3 < buffer->elements_)) goto LAB_00162b42;
    }
  } while (uVar2 < 0x1000000);
LAB_00162b42:
  if (0xffffff < new_elements) {
    raise<pstore::error_code>(unknown_process_path);
  }
  return uVar3;
}

Assistant:

std::size_t process_file_name (ProcessPathFunction get_process_path, BufferType & buffer) {
        static_assert (std::is_same<typename BufferType::value_type, char>::value,
                       "BufferType::value_type must be char");
        constexpr auto const max_reasonable_size = std::size_t{16 * 1024 * 1024};
        auto size = std::size_t{0};
        auto next_size = std::max (buffer.capacity (), std::size_t{2});
        do {
            buffer.resize (next_size);
            size = get_process_path (::pstore::gsl::make_span (buffer));
            next_size = std::max (size, next_size + next_size / 2U);
        } while ((size == 0 || size >= buffer.size ()) && next_size < max_reasonable_size);
        if (next_size >= max_reasonable_size) {
            raise (error_code::unknown_process_path);
        }
        return size;
    }